

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.h
# Opt level: O2

bool __thiscall Slicer::buildDG(Slicer *this,bool compute_deps)

{
  LLVMDependenceGraph *pLVar1;
  __uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *__u;
  raw_ostream *this_00;
  
  __u = (__uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *)
        dg::llvmdg::LLVMDependenceGraphBuilder::constructCFGOnly(&this->_builder);
  std::__uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::
  operator=((__uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
             *)&this->_dg,__u);
  pLVar1 = (this->_dg)._M_t.
           super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
           .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
  if (pLVar1 == (LLVMDependenceGraph *)0x0) {
    this_00 = (raw_ostream *)llvm::errs();
    llvm::raw_ostream::operator<<(this_00,"Building the dependence graph failed!\n");
  }
  else if (compute_deps) {
    computeDependencies(this);
  }
  return pLVar1 != (LLVMDependenceGraph *)0x0;
}

Assistant:

bool buildDG(bool compute_deps = false) {
        _dg = std::move(_builder.constructCFGOnly());

        if (!_dg) {
            llvm::errs() << "Building the dependence graph failed!\n";
            return false;
        }

        if (compute_deps)
            computeDependencies();

        return true;
    }